

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateRequestTimeAsync(HelicsFederate fed,HelicsTime requestTime,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  Time nextInternalTimeStep;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    nextInternalTimeStep.internalTimeCode = 0x7fffffffffffffff;
    if (requestTime <= -9223372036.854765) {
      nextInternalTimeStep.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (requestTime < 9223372036.854765) {
      nextInternalTimeStep.internalTimeCode =
           (baseType)
           (requestTime * 1000000000.0 +
           *(double *)(&DAT_004296c0 + (ulong)(0.0 <= requestTime * 1000000000.0) * 8));
    }
    helics::Federate::requestTimeAsync(this,nextInternalTimeStep);
  }
  return;
}

Assistant:

void helicsFederateRequestTimeAsync(HelicsFederate fed, HelicsTime requestTime, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->requestTimeAsync(requestTime);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}